

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

bool __thiscall
chaiscript::dispatch::Attribute_Access<int,_MyException>::operator==
          (Attribute_Access<int,_MyException> *this,Proxy_Function_Base *t_func)

{
  long local_40;
  Attribute_Access<int,_MyException> *aa;
  Proxy_Function_Base *t_func_local;
  Attribute_Access<int,_MyException> *this_local;
  
  if (t_func == (Proxy_Function_Base *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = __dynamic_cast(t_func,&Proxy_Function_Base::typeinfo,
                              &Attribute_Access<int,MyException>::typeinfo,0);
  }
  if (local_40 == 0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = this->m_attr == *(offset_in_MyException_to_int *)(local_40 + 0x40);
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const Proxy_Function_Base &t_func) const noexcept override {
        const Attribute_Access<T, Class> *aa = dynamic_cast<const Attribute_Access<T, Class> *>(&t_func);

        if (aa) {
          return m_attr == aa->m_attr;
        } else {
          return false;
        }
      }